

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteIntroduction
          (ReflectionClassGenerator *this,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string local_48;
  
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "// <auto-generated>\n//     Generated by the protocol buffer compiler.  DO NOT EDIT!\n//     source: $file_name$\n// </auto-generated>\n#pragma warning disable 1591, 0612, 3021\n#region Designer generated code\n\nusing pb = global::Google.Protobuf;\nusing pbc = global::Google.Protobuf.Collections;\nusing pbr = global::Google.Protobuf.Reflection;\nusing scg = global::System.Collections.Generic;\n"
             ,(char (*) [10])"file_name",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_);
  if ((this->namespace_)._M_string_length != 0) {
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"namespace $namespace$ {\n",(char (*) [10])0x2a2aa1,&this->namespace_);
    google::protobuf::io::Printer::Indent();
    io::Printer::Print<>(printer,"\n");
  }
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_;
  SourceGeneratorBase::class_access_level_abi_cxx11_(&local_48,&this->super_SourceGeneratorBase);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[13],std::__cxx11::string,char[22],std::__cxx11::string>
            (printer,
             "/// <summary>Holder for reflection information generated from $file_name$</summary>\n$access_level$ static partial class $reflection_class_name$ {\n\n"
             ,(char (*) [10])"file_name",args_1,(char (*) [13])"access_level",&local_48,
             (char (*) [22])0x2a5e86,&this->reflectionClassname_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  google::protobuf::io::Printer::Indent();
  return;
}

Assistant:

void ReflectionClassGenerator::WriteIntroduction(io::Printer* printer) {
  printer->Print(
    "// <auto-generated>\n"
    "//     Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "//     source: $file_name$\n"
    "// </auto-generated>\n"
    "#pragma warning disable 1591, 0612, 3021\n"
    "#region Designer generated code\n"
    "\n"
    "using pb = global::Google.Protobuf;\n"
    "using pbc = global::Google.Protobuf.Collections;\n"
    "using pbr = global::Google.Protobuf.Reflection;\n"
    "using scg = global::System.Collections.Generic;\n",
    "file_name", file_->name());

  if (!namespace_.empty()) {
    printer->Print("namespace $namespace$ {\n", "namespace", namespace_);
    printer->Indent();
    printer->Print("\n");
  }

  printer->Print(
    "/// <summary>Holder for reflection information generated from $file_name$</summary>\n"
    "$access_level$ static partial class $reflection_class_name$ {\n"
    "\n",
    "file_name", file_->name(),
    "access_level", class_access_level(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
}